

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O2

bool __thiscall BinGE<0,_1,_0>::propagate(BinGE<0,_1,_0> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  IntVar *pIVar4;
  long lVar5;
  IntVar *pIVar6;
  int64_t m_v;
  long lVar7;
  
  pIVar4 = (this->x).var;
  pIVar6 = (this->y).var;
  iVar2 = (pIVar4->max).v;
  lVar7 = -(long)(pIVar6->max).v;
  if ((pIVar4->min).v < (int)lVar7) {
    if (so.lazy) {
      iVar1 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[9])();
      lVar5 = (long)iVar1 * 4 + 2;
      pIVar4 = (this->x).var;
    }
    else {
      lVar5 = 0;
    }
    iVar1 = (*(pIVar4->super_Var).super_Branching._vptr_Branching[0xe])(pIVar4,lVar7,lVar5,1);
    if ((char)iVar1 == '\0') {
      return false;
    }
    pIVar6 = (this->y).var;
  }
  iVar1 = (pIVar6->min).v;
  iVar3 = -iVar1;
  if (SBORROW4(iVar2,iVar3) != iVar2 + iVar1 < 0) {
    if (so.lazy == true) {
      iVar1 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
      lVar7 = (long)iVar1 * 4 + 2;
      pIVar6 = (this->y).var;
    }
    else {
      lVar7 = 0;
    }
    iVar2 = (*(pIVar6->super_Var).super_Branching._vptr_Branching[0xe])(pIVar6,-(long)iVar2,lVar7,1)
    ;
    if ((char)iVar2 == '\0') {
      return false;
    }
    iVar3 = -(((this->y).var)->min).v;
  }
  if (iVar3 <= (((this->x).var)->min).v) {
    Tchar::operator=(&(this->super_Propagator).satisfied,'\x01');
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		const int64_t x_max = x.getMax();
		const int64_t y_min = y.getMin();

		// Can finesse!!
		if ((R != 0) && x_max < y_min) {
			setDom(r, setVal, 0, x.getMaxLit(), y.getMinLit());
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		// Finesses x's lower bound
		if (R != 0) {
			setDom(x, setMin, y_min, y.getMinLit(), r.getValLit());
		} else {
			setDom(x, setMin, y_min, y.getMinLit());
		}
		if (R != 0) {
			setDom(y, setMax, x_max, x.getMaxLit(), r.getValLit());
		} else {
			setDom(y, setMax, x_max, x.getMaxLit());
		}

		if (x.getMin() >= y.getMax()) {
			satisfied = true;
		}

		return true;
	}